

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O1

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::WeightedDigraphSPAcyclic
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph)

{
  size_t *psVar1;
  int iVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar4;
  pointer ppRVar5;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar6;
  __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*const_*,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
  _Var7;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar8;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar9;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  *__range2;
  pointer ppRVar10;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  nodes;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  local_58;
  undefined8 local_40;
  Node *local_38;
  
  this->_vptr_WeightedDigraphSPAcyclic = (_func_int **)&PTR__WeightedDigraphSPAcyclic_0010dcc8;
  (this->_edge_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010dab8;
  (this->_edge_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dae8;
  pLVar4 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
  (pLVar4->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010db48;
  pLVar4->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar4->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar4;
  (this->_edge_to)._list._tail = pLVar4;
  (this->_edge_to)._list._size = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinkedList_0010dae8;
  ppRVar5 = (pointer)operator_new(0x38);
  *ppRVar5 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)&PTR__ListNode_0010db18;
  ppRVar5[2] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)&PTR__SymbolTableElement_0010db48;
  ppRVar5[1] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  ppRVar5[4] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  ppRVar5[5] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  *(undefined4 *)(ppRVar5 + 6) = 0;
  local_40 = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppRVar5;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppRVar5;
  pLVar4 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
  (pLVar4->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010db48;
  pLVar4->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar4->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar4;
  (this->_edge_to)._list._tail = pLVar4;
  (this->_edge_to)._list._size = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinkedList_0010dae8;
  *ppRVar5 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)&PTR__ListNode_0010db18;
  ppRVar5[1] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  operator_delete(ppRVar5,0x38);
  local_40 = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_weight_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010db78;
  (this->_weight_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dba8;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010dc08;
  pLVar6->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar6;
  (this->_weight_to)._list._tail = pLVar6;
  (this->_weight_to)._list._size = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinkedList_0010dba8;
  ppRVar5 = (pointer)operator_new(0x20);
  *ppRVar5 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)&PTR__ListNode_0010dbd8;
  ppRVar5[2] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)&PTR__SymbolTableElement_0010dc08;
  ppRVar5[1] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  local_40 = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppRVar5;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppRVar5;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010dc08;
  pLVar6->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar6;
  (this->_weight_to)._list._tail = pLVar6;
  (this->_weight_to)._list._size = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinkedList_0010dba8;
  *ppRVar5 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)&PTR__ListNode_0010dbd8;
  ppRVar5[1] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  operator_delete(ppRVar5,0x20);
  local_40 = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->_marked_nodes).
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (this->_marked_nodes).
    super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  ppRVar5 = (this->_reserve_post_nodes).
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_reserve_post_nodes).
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppRVar5) {
    (this->_reserve_post_nodes).
    super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppRVar5;
  }
  data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getAllNodes
            (&local_58,&(graph->super_WeightedGraph<int,_int>)._tree);
  ppRVar5 = local_58.
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppRVar10 = local_58.
               super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_38 = *ppRVar10;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const*,std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>>,__gnu_cxx::__ops::_Iter_equals_val<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const>>
                        ((this->_marked_nodes).
                         super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->_marked_nodes).
                         super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_38);
      if (_Var7._M_current ==
          (this->_marked_nodes).
          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        _dfs(this,local_38);
      }
      ppRVar10 = ppRVar10 + 1;
    } while (ppRVar10 != ppRVar5);
  }
  pLVar4 = (this->_edge_to)._list._header;
  pRVar3 = *(this->_reserve_post_nodes).
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_start = (pRVar3->element).key;
  while (pLVar4 != (this->_edge_to)._list._tail) {
    pLVar8 = pLVar4->_next;
    if (pLVar8 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar4->_next = pLVar8->_next;
      (*pLVar8->_vptr_ListNode[1])(pLVar8);
    }
    if (pLVar8 == (this->_edge_to)._list._tail) {
      (this->_edge_to)._list._tail = pLVar4;
    }
    psVar1 = &(this->_edge_to)._list._size;
    *psVar1 = *psVar1 - 1;
    pLVar4 = (this->_edge_to)._list._header;
  }
  (this->_edge_to)._list._tail = pLVar4;
  (this->_edge_to)._list._size = 0;
  while (pLVar6 = (this->_weight_to)._list._header, pLVar6 != (this->_weight_to)._list._tail) {
    pLVar9 = pLVar6->_next;
    if (pLVar9 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar6->_next = pLVar9->_next;
      (*pLVar9->_vptr_ListNode[1])(pLVar9);
    }
    if (pLVar9 == (this->_weight_to)._list._tail) {
      (this->_weight_to)._list._tail = pLVar6;
    }
    psVar1 = &(this->_weight_to)._list._size;
    *psVar1 = *psVar1 - 1;
  }
  (this->_weight_to)._list._tail = pLVar6;
  (this->_weight_to)._list._size = 0;
  pLVar4 = (this->_edge_to)._list._header;
  iVar2 = this->_start;
  do {
    pLVar4 = pLVar4->_next;
    if (pLVar4 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar4 = (this->_edge_to)._list._tail;
      pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                *)operator_new(0x38);
      pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
      (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010db48;
      (pLVar8->element).value.from =
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0;
      (pLVar8->element).value.to =
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0;
      (pLVar8->element).key = iVar2;
      (pLVar8->element).value.from = pRVar3;
      (pLVar8->element).value.to = pRVar3;
      (pLVar8->element).value.weight = 0;
      pLVar8->_next =
           (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)0x0;
      pLVar8->_next = pLVar4->_next;
      pLVar4->_next = pLVar8;
      psVar1 = &(this->_edge_to)._list._size;
      *psVar1 = *psVar1 + 1;
      (this->_edge_to)._list._tail = pLVar8;
      goto LAB_00104068;
    }
  } while ((pLVar4->element).key != iVar2);
  (pLVar4->element).value.from = pRVar3;
  (pLVar4->element).value.to = pRVar3;
  (pLVar4->element).value.weight = 0;
LAB_00104068:
  pLVar9 = (this->_weight_to)._list._header;
  iVar2 = this->_start;
  do {
    pLVar9 = pLVar9->_next;
    if (pLVar9 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar9 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
      pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
      (pLVar9->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010dc08;
      (pLVar9->element).key = iVar2;
      (pLVar9->element).value = 0;
      pLVar9->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
      pLVar9->_next = pLVar6->_next;
      pLVar6->_next = pLVar9;
      (this->_weight_to)._list._size = 1;
      (this->_weight_to)._list._tail = pLVar9;
      goto LAB_001040cd;
    }
  } while ((pLVar9->element).key != iVar2);
  (pLVar9->element).value = 0;
LAB_001040cd:
  ppRVar10 = (this->_reserve_post_nodes).
             super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar5 = (this->_reserve_post_nodes).
                 super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar5 != ppRVar10;
      ppRVar5 = ppRVar5 + 1) {
    _relax(this,graph,*ppRVar5);
  }
  if (local_58.
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

WeightedDigraphSPAcyclic(WeightedDigraph<T, Weight> &graph) {
            _marked_nodes.clear();
            _reserve_post_nodes.clear();
            auto nodes = graph.getAllNodes();
            // Topological sorting
            for (auto node: nodes) {
                if (!isInVector<Node*>(_marked_nodes, node)) {
                    _dfs(node);
                }
            }

            auto start_node = _reserve_post_nodes[0];
            _start = start_node->element.key;
            _edge_to.clear();
            _weight_to.clear();
            _edge_to.set(_start, Edge(start_node, start_node, Weight()));
            _weight_to.set(_start, Weight());

            for (auto node: _reserve_post_nodes) {
                _relax(graph, node);
            }
        }